

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O2

double __thiscall UniValue::get_real(UniValue *this)

{
  string *str;
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  runtime_error *this_00;
  double local_1a0;
  locale local_198 [8];
  istringstream text;
  uint auStack_170 [88];
  
  if (this->typ == VNUM) {
    str = &this->val;
    bVar3 = anon_unknown.dwarf_b78e53::ParsePrechecks(str);
    if ((bVar3) &&
       ((((this->val)._M_string_length < 2 || (pcVar2 = (str->_M_dataplus)._M_p, *pcVar2 != '0')) ||
        (pcVar2[1] != 'x')))) {
      std::__cxx11::istringstream::istringstream((istringstream *)&text,(string *)str,_S_in);
      std::locale::classic();
      std::ios::imbue(local_198);
      std::locale::~locale(local_198);
      std::istream::_M_extract<double>((double *)&text);
      uVar1 = *(uint *)((long)auStack_170 + *(long *)(_text + -0x18));
      std::__cxx11::istringstream::~istringstream((istringstream *)&text);
      if ((uVar1 & 7) == 2) {
        return local_1a0;
      }
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON double out of range");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON value is not a number as expected");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double UniValue::get_real() const
{
    if (typ != VNUM)
        throw std::runtime_error("JSON value is not a number as expected");
    double retval;
    if (!ParseDouble(getValStr(), &retval))
        throw std::runtime_error("JSON double out of range");
    return retval;
}